

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-3339_type.h
# Opt level: O0

bool date::rfc3339::validate(parts *dt)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  parts *dt_local;
  
  if ((((dt->year == 0) || (dt->month == '\0')) || (0xc < dt->month)) ||
     ((dt->day == '\0' ||
      (bVar1 = dt->day, bVar2 = calendar_helper::days_in_month(dt->year,dt->month), bVar2 < bVar1)))
     ) {
    return false;
  }
  if (0x17 < dt->hour) {
    return false;
  }
  if (dt->minute < 0x3c) {
    if (0x3b < dt->second) {
      return false;
    }
    if (dt->nanosecond < 1000000000) {
      iVar3 = (int)dt->offset_in_minutes;
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      if (iVar3 < 0x5a0) {
        return true;
      }
      return false;
    }
    return false;
  }
  return false;
}

Assistant:

static bool validate(const parts& dt)
    {
        if (dt.year == 0)
            return false;
        if (dt.month == 0 || dt.month > 12)
            return false;
        if (dt.day == 0 || dt.day > calendar_helper::days_in_month(dt.year, dt.month))
            return false;
        if (dt.hour > 23)
            return false;
        if (dt.minute > 59)
            return false;
        if (dt.second > 59)
            return false;
        if (dt.nanosecond > 999999999)
            return false;
        if (std::abs(dt.offset_in_minutes) > 1439)
            return false;
        return true;
    }